

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FallbackToSnprintf<long_double>
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  string_view v_00;
  string_view v_01;
  FormatConversionChar c;
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t __maxlen;
  ulong uVar4;
  ulong uVar5;
  FormatConversionSpecImpl *extraout_RDX;
  FormatConversionSpecImpl *extraout_RDX_00;
  FormatConversionSpecImpl *spec;
  undefined8 in_R9;
  string_view v_02;
  uint local_130;
  uint local_12c;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  undefined4 local_100;
  int local_fc;
  undefined1 auStack_f8 [4];
  int n;
  string_view result;
  string local_e0 [8];
  string space;
  size_t local_b8;
  string local_a0;
  undefined1 local_80 [16];
  char *local_70;
  char *fp;
  char fmt [32];
  int p;
  int w;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  longdouble v_local;
  bool local_9;
  
  iVar2 = FormatConversionSpecImpl::width(conv);
  if (iVar2 < 0) {
    local_12c = 0;
  }
  else {
    local_12c = FormatConversionSpecImpl::width(conv);
  }
  iVar2 = FormatConversionSpecImpl::precision(conv);
  if (iVar2 < 0) {
    local_130 = 0xffffffff;
    spec = extraout_RDX;
  }
  else {
    local_130 = FormatConversionSpecImpl::precision(conv);
    spec = extraout_RDX_00;
  }
  pcVar3 = (char *)((long)&fp + 1);
  fp._0_1_ = 0x25;
  local_70 = pcVar3;
  FormatConversionSpecImplFriend::FlagsToString_abi_cxx11_
            (&local_a0,(FormatConversionSpecImplFriend *)conv,spec);
  local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
  v_01._M_str = local_70;
  v_01._M_len = local_80._8_8_;
  local_70 = CopyStringTo(local_80._0_8_,v_01,pcVar3);
  std::__cxx11::string::~string((string *)&local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&space.field_2 + 8),"*.*");
  v_02._M_str = local_70;
  v_02._M_len = local_b8;
  pcVar3 = CopyStringTo((anon_unknown_0 *)space.field_2._8_8_,v_02,pcVar3);
  local_70 = pcVar3 + 1;
  *pcVar3 = 'L';
  c = FormatConversionSpecImpl::conversion_char(conv);
  cVar1 = FormatConversionCharToChar(c);
  pcVar3 = local_70 + 1;
  *local_70 = cVar1;
  *pcVar3 = '\0';
  local_70 = pcVar3;
  if (fmt + 0x18 <= pcVar3) {
    __assert_fail("fp < fmt + sizeof(fmt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3d2,
                  "bool absl::str_format_internal::(anonymous namespace)::FallbackToSnprintf(const Float, const FormatConversionSpecImpl &, FormatSinkImpl *) [Float = long double]"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,0x200,'\0',(allocator<char> *)((long)&result._M_str + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&result._M_str + 7));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f8);
  do {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
    __maxlen = std::__cxx11::string::size();
    local_fc = snprintf(pcVar3,__maxlen,(char *)&fp,(ulong)local_12c,(ulong)local_130,in_R9,v);
    if (local_fc < 0) {
      local_9 = false;
LAB_009192ea:
      local_100 = 1;
      std::__cxx11::string::~string(local_e0);
      return local_9;
    }
    uVar4 = (ulong)local_fc;
    uVar5 = std::__cxx11::string::size();
    if (uVar4 < uVar5) {
      pcVar3 = (char *)std::__cxx11::string::data();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,pcVar3,(long)local_fc);
      _auStack_f8 = local_110._M_len;
      result._M_len = (size_t)local_110._M_str;
      v_00._M_str = local_110._M_str;
      v_00._M_len = local_110._M_len;
      FormatSinkImpl::Append(sink,v_00);
      local_9 = true;
      goto LAB_009192ea;
    }
    std::__cxx11::string::resize((ulong)local_e0);
  } while( true );
}

Assistant:

bool FallbackToSnprintf(const Float v, const FormatConversionSpecImpl &conv,
                        FormatSinkImpl *sink) {
  int w = conv.width() >= 0 ? conv.width() : 0;
  int p = conv.precision() >= 0 ? conv.precision() : -1;
  char fmt[32];
  {
    char *fp = fmt;
    *fp++ = '%';
    fp = CopyStringTo(FormatConversionSpecImplFriend::FlagsToString(conv), fp);
    fp = CopyStringTo("*.*", fp);
    if (std::is_same<long double, Float>()) {
      *fp++ = 'L';
    }
    *fp++ = FormatConversionCharToChar(conv.conversion_char());
    *fp = 0;
    assert(fp < fmt + sizeof(fmt));
  }
  std::string space(512, '\0');
  absl::string_view result;
  while (true) {
    int n = snprintf(&space[0], space.size(), fmt, w, p, v);
    if (n < 0) return false;
    if (static_cast<size_t>(n) < space.size()) {
      result = absl::string_view(space.data(), static_cast<size_t>(n));
      break;
    }
    space.resize(static_cast<size_t>(n) + 1);
  }
  sink->Append(result);
  return true;
}